

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ConsumeNumber(Parser *this,double *output,ErrorMaker error)

{
  TokenType TVar1;
  pointer __s1;
  bool bVar2;
  int iVar3;
  size_type __rlen;
  Tokenizer *this_00;
  double dVar4;
  uint64_t value;
  uint64_t local_38;
  
  this_00 = this->input_;
  TVar1 = (this_00->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    local_38 = 0;
    bVar2 = io::Tokenizer::ParseInteger(&(this_00->current_).text,0xffffffffffffffff,&local_38);
    if (bVar2) {
      *output = ((double)CONCAT44(0x45300000,(int)(local_38 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0);
    }
    else if ((*(this->input_->current_).text._M_dataplus._M_p == '0') ||
            (bVar2 = io::Tokenizer::TryParseFloat(&(this->input_->current_).text,output), !bVar2)) {
      RecordError(this,(ErrorMaker)ZEXT816(0x13ab65a));
    }
  }
  else {
    if (TVar1 != TYPE_FLOAT) {
      if ((this_00->current_).text._M_string_length != 3) {
LAB_00efd8ce:
        RecordError(this,error);
        return false;
      }
      __s1 = (this_00->current_).text._M_dataplus._M_p;
      iVar3 = bcmp(__s1,"inf",3);
      if (iVar3 == 0) {
        dVar4 = INFINITY;
      }
      else {
        iVar3 = bcmp(__s1,"nan",3);
        if (iVar3 != 0) goto LAB_00efd8ce;
        dVar4 = NAN;
      }
      *output = dVar4;
      goto LAB_00efd910;
    }
    dVar4 = io::Tokenizer::ParseFloat(&(this_00->current_).text);
    *output = dVar4;
  }
  this_00 = this->input_;
LAB_00efd910:
  io::Tokenizer::Next(this_00);
  return true;
}

Assistant:

bool Parser::ConsumeNumber(double* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
    *output = io::Tokenizer::ParseFloat(input_->current().text);
    input_->Next();
    return true;
  } else if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    // Also accept integers.
    uint64_t value = 0;
    if (io::Tokenizer::ParseInteger(input_->current().text,
                                    std::numeric_limits<uint64_t>::max(),
                                    &value)) {
      *output = value;
    } else if (input_->current().text[0] == '0') {
      // octal or hexadecimal; don't bother parsing as float
      RecordError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    } else if (!io::Tokenizer::TryParseFloat(input_->current().text, output)) {
      // out of int range, and not valid float? 🤷
      RecordError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    }
    input_->Next();
    return true;
  } else if (LookingAt("inf")) {
    *output = std::numeric_limits<double>::infinity();
    input_->Next();
    return true;
  } else if (LookingAt("nan")) {
    *output = std::numeric_limits<double>::quiet_NaN();
    input_->Next();
    return true;
  } else {
    RecordError(error);
    return false;
  }
}